

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O1

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::reduce_over_mpi(StackNode *this,bool mpi_usable)

{
  StackNode *pSVar1;
  _Rb_tree_node_base *p_Var2;
  queue<KokkosTools::SpaceTimeStack::StackNode_*,_std::deque<KokkosTools::SpaceTimeStack::StackNode_*,_std::allocator<KokkosTools::SpaceTimeStack::StackNode_*>_>_>
  q;
  StackNode *local_80;
  _Deque_base<KokkosTools::SpaceTimeStack::StackNode_*,_std::allocator<KokkosTools::SpaceTimeStack::StackNode_*>_>
  local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<KokkosTools::SpaceTimeStack::StackNode_*,_std::allocator<KokkosTools::SpaceTimeStack::StackNode_*>_>
  ::_M_initialize_map(&local_78,0);
  local_80 = this;
  std::
  deque<KokkosTools::SpaceTimeStack::StackNode*,std::allocator<KokkosTools::SpaceTimeStack::StackNode*>>
  ::emplace_back<KokkosTools::SpaceTimeStack::StackNode*>
            ((deque<KokkosTools::SpaceTimeStack::StackNode*,std::allocator<KokkosTools::SpaceTimeStack::StackNode*>>
              *)&local_78,&local_80);
  if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pSVar1 = *local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_78._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_78._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_78._M_impl.super__Deque_impl_data._M_start._M_last =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_78._M_impl.super__Deque_impl_data._M_start._M_first =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_78._M_impl.super__Deque_impl_data._M_start._M_node =
             local_78._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pSVar1->max_runtime = pSVar1->total_runtime;
      pSVar1->avg_runtime = pSVar1->total_runtime;
      for (p_Var2 = (pSVar1->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(pSVar1->children)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        local_80 = (StackNode *)(p_Var2 + 1);
        std::
        deque<KokkosTools::SpaceTimeStack::StackNode*,std::allocator<KokkosTools::SpaceTimeStack::StackNode*>>
        ::emplace_back<KokkosTools::SpaceTimeStack::StackNode*>
                  ((deque<KokkosTools::SpaceTimeStack::StackNode*,std::allocator<KokkosTools::SpaceTimeStack::StackNode*>>
                    *)&local_78,&local_80);
      }
    } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  _Deque_base<KokkosTools::SpaceTimeStack::StackNode_*,_std::allocator<KokkosTools::SpaceTimeStack::StackNode_*>_>
  ::~_Deque_base(&local_78);
  return;
}

Assistant:

void reduce_over_mpi(bool mpi_usable) {
#if USE_MPI
    if (mpi_usable) {
      int rank, comm_size;
      MPI_Comm_rank(MPI_COMM_WORLD, &rank);
      MPI_Comm_size(MPI_COMM_WORLD, &comm_size);
      std::queue<StackNode*> q;
      std::set<std::pair<std::string, StackKind>> children_to_process;
      q.push(this);
      while (!q.empty()) {
        auto node = q.front();
        q.pop();
        node->max_runtime = node->total_runtime;
        node->avg_runtime = node->total_runtime;
        MPI_Allreduce(MPI_IN_PLACE, &(node->total_runtime), 1, MPI_DOUBLE,
                      MPI_SUM, MPI_COMM_WORLD);
        MPI_Allreduce(MPI_IN_PLACE, &(node->max_runtime), 1, MPI_DOUBLE,
                      MPI_MAX, MPI_COMM_WORLD);
        MPI_Allreduce(MPI_IN_PLACE, &(node->avg_runtime), 1, MPI_DOUBLE,
                      MPI_SUM, MPI_COMM_WORLD);
        node->avg_runtime /= comm_size;
        MPI_Allreduce(MPI_IN_PLACE, &(node->total_kokkos_runtime), 1,
                      MPI_DOUBLE, MPI_SUM, MPI_COMM_WORLD);
        /* Not all children necessarily exist on every rank. To handle this we
           will: 1) Build a set of the child node names on each rank. 2) Start
           with rank 0, broadcast all of it's child names and add them to the
              queue, removing them from the set of names to be processed.
              If a child doesn't exist on a rank we add an empty node for it.
           3) Do a check for the lowest rank that has any remaining unprocessed
           children and repeat step 2 broadcasting from that rank until we
           process all children from all ranks.
         */
        children_to_process.clear();
        for (auto& child : node->children) {
          children_to_process.emplace(child.name, child.kind);
        }

        int bcast_rank = 0;
        do {
          int nchildren_to_process = int(children_to_process.size());
          MPI_Bcast(&nchildren_to_process, 1, MPI_INT, bcast_rank,
                    MPI_COMM_WORLD);
          if (rank == bcast_rank) {
            for (auto& child_info : children_to_process) {
              std::string child_name = child_info.first;
              int kind               = child_info.second;
              int name_len           = child_name.length();
              MPI_Bcast(&name_len, 1, MPI_INT, bcast_rank, MPI_COMM_WORLD);
              MPI_Bcast(&child_name[0], name_len, MPI_CHAR, bcast_rank,
                        MPI_COMM_WORLD);
              MPI_Bcast(&kind, 1, MPI_INT, bcast_rank, MPI_COMM_WORLD);
              auto* child =
                  node->get_child(std::move(child_name), StackKind(kind));
              q.push(child);
            }
            children_to_process.clear();
          } else {
            for (int i = 0; i < nchildren_to_process; ++i) {
              int name_len;
              MPI_Bcast(&name_len, 1, MPI_INT, bcast_rank, MPI_COMM_WORLD);
              std::string name(size_t(name_len), '?');
              MPI_Bcast(&name[0], name_len, MPI_CHAR, bcast_rank,
                        MPI_COMM_WORLD);
              int kind;
              MPI_Bcast(&kind, 1, MPI_INT, bcast_rank, MPI_COMM_WORLD);
              auto child = node->get_child(std::move(name), StackKind(kind));
              q.push(child);
              children_to_process.erase({child->name, child->kind});
            }
          }
          int local_next_bcast_rank =
              children_to_process.empty() ? comm_size : rank;
          MPI_Allreduce(&local_next_bcast_rank, &bcast_rank, 1, MPI_INT,
                        MPI_MIN, MPI_COMM_WORLD);
        } while (bcast_rank < comm_size);
      }
    } else
#else
    (void)mpi_usable;
#endif
    {
      std::queue<StackNode*> q;
      q.push(this);
      while (!q.empty()) {
        auto node = q.front();
        q.pop();
        node->max_runtime = node->total_runtime;
        node->avg_runtime = node->total_runtime;
        for (auto& child : node->children) {
          q.push(const_cast<StackNode*>(&child));
        }
      }
    }
  }